

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O1

void __thiscall
AI::SoundMap::injectSound
          (SoundMap *this,Vector2<float> originalPosition,float initialIntensity,AuditoryTag tag)

{
  undefined1 auVar1 [16];
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  SoundSource source;
  value_type local_68;
  undefined1 local_28 [16];
  
  local_68.radius = 1;
  local_68.initialIntensity = 0.0;
  local_68.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = originalPosition;
  local_28._12_4_ = in_XMM0_Dd;
  local_68.gridCoordinates = calcGridCoordinates(originalPosition,this->resolution,this->gridSize);
  auVar1 = local_28;
  local_68.originalPosition.x = (float)local_28._0_4_;
  local_68.originalPosition.y = (float)local_28._4_4_;
  local_68.id = this->nextSourceId;
  local_68.initialIntensity = initialIntensity;
  local_68.tag = tag;
  local_28 = auVar1;
  std::vector<AI::SoundSource,_std::allocator<AI::SoundSource>_>::push_back
            (&this->sources,&local_68);
  this->nextSourceId = this->nextSourceId + 1;
  if (local_68.blockedRanges.super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.blockedRanges.
                    super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.blockedRanges.
                          super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.blockedRanges.
                          super__Vector_base<AI::BlockedRange,_std::allocator<AI::BlockedRange>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SoundMap::injectSound(Vector2<float> originalPosition, float initialIntensity, AuditoryTag tag)
	{			
		SoundSource source;
		source.gridCoordinates = calcGridCoordinates(originalPosition, resolution, gridSize);
		source.originalPosition = originalPosition;
		source.id = nextSourceId;
		source.initialIntensity = initialIntensity;
		source.tag = tag;

		sources.push_back(source);
		nextSourceId++;
	}